

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::PulseStyleDeclarationSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,PulseStyleDeclarationSyntax *this,size_t index
          )

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    pSVar1 = &(this->super_MemberSyntax).attributes;
    break;
  case 1:
    uVar3._0_2_ = (this->keyword).kind;
    uVar3._2_1_ = (this->keyword).field_0x2;
    uVar3._3_1_ = (this->keyword).numFlags;
    uVar4 = (this->keyword).rawLen;
    uVar5 = *(undefined4 *)&(this->keyword).info;
    uVar6 = *(undefined4 *)((long)&(this->keyword).info + 4);
    goto LAB_0016f1dc;
  case 2:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->inputs).super_SyntaxListBase;
    break;
  case 3:
    uVar3._0_2_ = (this->semi).kind;
    uVar3._2_1_ = (this->semi).field_0x2;
    uVar3._3_1_ = (this->semi).numFlags;
    uVar4 = (this->semi).rawLen;
    uVar5 = *(undefined4 *)&(this->semi).info;
    uVar6 = *(undefined4 *)((long)&(this->semi).info + 4);
LAB_0016f1dc:
    *(undefined4 *)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3
    ;
    *(uint32_t *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 4) = uVar4;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 8) = uVar5;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
     + 0xc) = uVar6;
LAB_0016f1e9:
    _Var2 = '\0';
    goto LAB_0016f1eb;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_0016f1e9;
  }
  *(SyntaxNode **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
  _Var2 = '\x01';
LAB_0016f1eb:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax PulseStyleDeclarationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return &inputs;
        case 3: return semi;
        default: return nullptr;
    }
}